

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::Context::Context(Context *this,Value *values,shared_ptr<minja::Context> *parent)

{
  runtime_error *this_00;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->super_enable_shared_from_this<minja::Context>)._M_weak_this.
  super___weak_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<minja::Context>)._M_weak_this.
  super___weak_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Context = (_func_int **)&PTR__Context_0022b530;
  Value::Value(&this->values_,values);
  std::__shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->parent_).super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>,
             &parent->super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>);
  if ((this->values_).object_.
      super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  Value::dump_abi_cxx11_(&sStack_68,&this->values_,-1,false);
  std::operator+(&local_48,"Context values must be an object: ",&sStack_68);
  std::runtime_error::runtime_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Context(Value && values, const std::shared_ptr<Context> & parent = nullptr) : values_(std::move(values)), parent_(parent) {
        if (!values_.is_object()) throw std::runtime_error("Context values must be an object: " + values_.dump());
    }